

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

double ZopfliCalculateBlockSizeAutoType(ZopfliLZ77Store *lz77,size_t lstart,size_t lend)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = ZopfliCalculateBlockSize(lz77,lstart,lend,0);
  dVar2 = dVar1;
  if (lz77->size < 0x3e9) {
    dVar2 = ZopfliCalculateBlockSize(lz77,lstart,lend,1);
  }
  dVar3 = ZopfliCalculateBlockSize(lz77,lstart,lend,2);
  if ((dVar2 <= dVar1 || dVar3 <= dVar1) && (dVar1 = dVar2, dVar3 <= dVar2)) {
    dVar1 = dVar3;
  }
  return dVar1;
}

Assistant:

double ZopfliCalculateBlockSizeAutoType(const ZopfliLZ77Store* lz77,
                                        size_t lstart, size_t lend) {
  double uncompressedcost = ZopfliCalculateBlockSize(lz77, lstart, lend, 0);
  /* Don't do the expensive fixed cost calculation for larger blocks that are
     unlikely to use it. */
  double fixedcost = (lz77->size > 1000) ?
      uncompressedcost : ZopfliCalculateBlockSize(lz77, lstart, lend, 1);
  double dyncost = ZopfliCalculateBlockSize(lz77, lstart, lend, 2);
  return (uncompressedcost < fixedcost && uncompressedcost < dyncost)
      ? uncompressedcost
      : (fixedcost < dyncost ? fixedcost : dyncost);
}